

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<Eigen::Matrix<double,_1,_1,_1,_1,_1>,_void>::load
          (type_caster<Eigen::Matrix<double,_1,_1,_1,_1,_1>,_void> *this,handle src,bool convert)

{
  _func_int_PyObject_ptr_PyObject_ptr *p_Var1;
  PyObject *pPVar2;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  npy_api *pnVar6;
  PyObject **ppPVar7;
  int result;
  array local_c0;
  handle local_b8;
  PyObject *local_b0;
  PyObject *local_a8;
  handle local_a0;
  array ref;
  undefined1 local_80 [8];
  EigenConformable<true> fits;
  ssize_t dims;
  handle local_38;
  array buf;
  bool convert_local;
  type_caster<Eigen::Matrix<double,_1,_1,_1,_1,_1>,_void> *this_local;
  handle src_local;
  
  if ((convert) ||
     (buf.super_buffer.super_object.super_handle.m_ptr = (buffer)(buffer)src.m_ptr,
     bVar3 = isinstance<pybind11::array_t<double,_16>,_0>(src), bVar3)) {
    array::ensure((array *)&local_38,src,0);
    bVar3 = handle::operator_cast_to_bool(&local_38);
    if (bVar3) {
      fits._40_8_ = array::ndim((array *)&local_38);
      if (((long)fits._40_8_ < 1) || (2 < (long)fits._40_8_)) {
        src_local.m_ptr._7_1_ = false;
      }
      else {
        EigenProps<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>::conformable
                  ((EigenConformable<true> *)local_80,(array *)&local_38);
        bVar3 = EigenConformable::operator_cast_to_bool((EigenConformable *)local_80);
        if (bVar3) {
          Eigen::Matrix<double,1,1,1,1,1>::Matrix<long,long>
                    ((Matrix<double,1,1,1,1,1> *)&ref,(long *)&fits,&fits.rows);
          Eigen::Matrix<double,_1,_1,_1,_1,_1>::operator=
                    (&this->value,(Matrix<double,_1,_1,_1,_1,_1> *)&ref);
          none::none((none *)&local_b8);
          local_b0 = local_b8.m_ptr;
          local_a8 = (PyObject *)
                     eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>>
                               (&this->value,local_b8);
          reinterpret_steal<pybind11::array>((pybind11 *)&local_a0,(handle)local_a8);
          none::~none((none *)&local_b8);
          if (fits._40_8_ == 1) {
            array::squeeze(&local_c0);
            array::operator=((array *)&local_a0,&local_c0);
            array::~array(&local_c0);
          }
          else {
            sVar5 = array::ndim((array *)&local_a0);
            if (sVar5 == 1) {
              array::squeeze((array *)&stack0xffffffffffffff38);
              array::operator=((array *)&local_38,(array *)&stack0xffffffffffffff38);
              array::~array((array *)&stack0xffffffffffffff38);
            }
          }
          pnVar6 = npy_api::get();
          p_Var1 = pnVar6->PyArray_CopyInto_;
          ppPVar7 = handle::ptr(&local_a0);
          pPVar2 = *ppPVar7;
          ppPVar7 = handle::ptr(&local_38);
          iVar4 = (*p_Var1)(pPVar2,*ppPVar7);
          src_local.m_ptr._7_1_ = -1 < iVar4;
          if (!src_local.m_ptr._7_1_) {
            PyErr_Clear();
          }
          array::~array((array *)&local_a0);
        }
        else {
          src_local.m_ptr._7_1_ = false;
        }
      }
    }
    else {
      src_local.m_ptr._7_1_ = false;
    }
    array::~array((array *)&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load(handle src, bool convert) {
        // If we're in no-convert mode, only load if given an array of the correct type
        if (!convert && !isinstance<array_t<Scalar>>(src))
            return false;

        // Coerce into an array, but don't do type conversion yet; the copy below handles it.
        auto buf = array::ensure(src);

        if (!buf)
            return false;

        auto dims = buf.ndim();
        if (dims < 1 || dims > 2)
            return false;

        auto fits = props::conformable(buf);
        if (!fits)
            return false;

        // Allocate the new type, then build a numpy reference into it
        value = Type(fits.rows, fits.cols);
        auto ref = reinterpret_steal<array>(eigen_ref_array<props>(value));
        if (dims == 1) ref = ref.squeeze();
        else if (ref.ndim() == 1) buf = buf.squeeze();

        int result = detail::npy_api::get().PyArray_CopyInto_(ref.ptr(), buf.ptr());

        if (result < 0) { // Copy failed!
            PyErr_Clear();
            return false;
        }

        return true;
    }